

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

void __thiscall doublechecked::Roaring::removeRangeClosed(Roaring *this,uint32_t min,uint32_t max)

{
  _Base_ptr *pp_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator __last;
  const_iterator __first;
  bool bVar4;
  
  roaring_bitmap_remove_range_closed((roaring_bitmap_t *)this,min,max);
  if (min <= max) {
    p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __last._M_node = &(this->check)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var2;
    __first._M_node = __last._M_node;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        bVar4 = p_Var3[1]._M_color < min;
        if (!bVar4) {
          __first._M_node = p_Var3;
        }
        pp_Var1 = &p_Var3->_M_left;
        p_Var3 = pp_Var1[bVar4];
      } while (pp_Var1[bVar4] != (_Base_ptr)0x0);
      do {
        if (max < p_Var2[1]._M_color) {
          __last._M_node = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[p_Var2[1]._M_color <= max];
      } while (p_Var2 != (_Base_ptr)0x0);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux(&(this->check)._M_t,__first,__last);
    return;
  }
  return;
}

Assistant:

void removeRangeClosed(uint32_t min, uint32_t max) {
        plain.removeRangeClosed(min, max);
        if (min <= max) {
            check.erase(check.lower_bound(min), check.upper_bound(max));
        }
    }